

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# field_mask_util.cc
# Opt level: O1

bool __thiscall
google::protobuf::util::FieldMaskUtil::IsPathInFieldMask
          (FieldMaskUtil *this,StringPiece path,FieldMask *mask)

{
  FieldMaskUtil *__s2;
  char *size;
  pointer pcVar1;
  StringPiece x;
  long lVar2;
  char *__n;
  int iVar3;
  Type *pTVar4;
  undefined1 __s1 [8];
  int index;
  stringpiece_ssize_type len;
  StringPiece local_90;
  RepeatedPtrFieldBase *local_80;
  long local_78;
  FieldMaskUtil *local_70;
  char *local_68;
  size_t local_60;
  char local_58 [16];
  undefined1 local_48 [8];
  StringPiece path_local;
  
  local_78 = path.length_;
  path_local.ptr_ = path.ptr_;
  path_local.length_._7_1_ = 0 < *(int *)(local_78 + 0x18);
  if (0 < *(int *)(local_78 + 0x18)) {
    local_80 = (RepeatedPtrFieldBase *)(local_78 + 0x10);
    index = 0;
    local_48 = (undefined1  [8])this;
    do {
      pTVar4 = protobuf::internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
                         (local_80,index);
      __n = path_local.ptr_;
      __s2 = (FieldMaskUtil *)(pTVar4->_M_dataplus)._M_p;
      size = (char *)pTVar4->_M_string_length;
      __s1 = local_48;
      if ((long)size < 0) {
        local_70 = (FieldMaskUtil *)local_48;
        StringPiece::LogFatalSizeTooBig((size_t)size,"size_t to int conversion");
        __s1 = (undefined1  [8])local_70;
      }
      if (__n == size) {
        if (((long)__n < 1) || (__s1 == (undefined1  [8])__s2)) break;
        iVar3 = bcmp((void *)__s1,__s2,(size_t)__n);
        if (iVar3 == 0) break;
      }
      lVar2 = local_78;
      if ((char *)pTVar4->_M_string_length < path_local.ptr_) {
        local_90 = StringPiece::substr((StringPiece *)local_48,0,
                                       (size_type)((char *)pTVar4->_M_string_length + 1));
        local_68 = local_58;
        pcVar1 = (pTVar4->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_68,pcVar1,pcVar1 + pTVar4->_M_string_length);
        std::__cxx11::string::append((char *)&local_68);
        x.length_ = local_60;
        x.ptr_ = local_68;
        if ((long)local_60 < 0) {
          StringPiece::LogFatalSizeTooBig(local_60,"size_t to int conversion");
        }
        iVar3 = StringPiece::compare(&local_90,x);
        if (local_68 != local_58) {
          operator_delete(local_68);
        }
        if (iVar3 == 0) break;
      }
      index = index + 1;
      path_local.length_._7_1_ = index < *(int *)(lVar2 + 0x18);
    } while (index < *(int *)(lVar2 + 0x18));
  }
  return (bool)(path_local.length_._7_1_ & 1);
}

Assistant:

bool FieldMaskUtil::IsPathInFieldMask(StringPiece path,
                                      const FieldMask& mask) {
  for (int i = 0; i < mask.paths_size(); ++i) {
    const std::string& mask_path = mask.paths(i);
    if (path == mask_path) {
      return true;
    } else if (mask_path.length() < path.length()) {
      // Also check whether mask.paths(i) is a prefix of path.
      if (path.substr(0, mask_path.length() + 1).compare(mask_path + ".") ==
          0) {
        return true;
      }
    }
  }
  return false;
}